

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageResizeCanvas(Image *image,int newWidth,int newHeight,int offsetX,int offsetY,Color fill)

{
  int iVar1;
  int iVar2;
  void *dstPtr;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t __n;
  void *pvVar6;
  long lVar7;
  long lVar8;
  void *__src;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_54;
  long local_50;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    iVar4 = image->format;
    if (0xd < iVar4) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar1 = image->width;
    if ((iVar1 != newWidth) || (image->height != newHeight)) {
      fVar11 = (float)iVar1;
      fVar10 = (float)offsetX;
      if (offsetX < 0) {
        fVar11 = fVar11 + fVar10;
        lVar8 = (long)(int)(float)-offsetX;
        fVar10 = 0.0;
      }
      else {
        if (newWidth < iVar1 + offsetX) {
          fVar11 = (float)(newWidth - offsetX);
        }
        lVar8 = 0;
      }
      fVar12 = (float)image->height;
      local_54 = (float)offsetY;
      if (offsetY < 0) {
        fVar12 = fVar12 + local_54;
        local_50 = (long)(int)(float)-offsetY;
        local_54 = 0.0;
      }
      else {
        if (newHeight < image->height + offsetY) {
          fVar12 = (float)(newHeight - offsetY);
        }
        local_50 = 0;
      }
      iVar2 = GetPixelDataSize(1,1,iVar4);
      dstPtr = calloc((long)(newHeight * newWidth * iVar2),1);
      SetPixelColor(dstPtr,fill,iVar4);
      __n = (size_t)iVar2;
      if (1 < newWidth) {
        lVar7 = (ulong)(uint)newWidth - 1;
        pvVar6 = dstPtr;
        do {
          pvVar6 = (void *)(__n + (long)pvVar6);
          memcpy(pvVar6,dstPtr,__n);
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      fVar9 = (float)newHeight;
      if (fVar12 <= (float)newHeight) {
        fVar9 = fVar12;
      }
      if (1 < newHeight) {
        iVar3 = iVar2 * newWidth;
        lVar7 = (ulong)(uint)newHeight - 1;
        iVar4 = iVar3;
        do {
          memcpy((void *)((long)iVar4 + (long)dstPtr),dstPtr,(long)iVar3);
          iVar4 = iVar4 + iVar3;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      if (0 < (int)fVar9) {
        fVar12 = (float)newWidth;
        if (fVar11 <= (float)newWidth) {
          fVar12 = fVar11;
        }
        uVar5 = (ulong)(uint)(int)fVar9;
        pvVar6 = (void *)((long)dstPtr + (long)(((int)fVar10 + (int)local_54 * newWidth) * iVar2));
        __src = (void *)((lVar8 + local_50 * iVar1) * __n + (long)image->data);
        do {
          memcpy(pvVar6,__src,(long)((int)fVar12 * iVar2));
          pvVar6 = (void *)((long)pvVar6 + (long)(iVar2 * newWidth));
          __src = (void *)((long)__src + __n * (long)iVar1);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      free(image->data);
      image->data = dstPtr;
      image->width = newWidth;
      image->height = newHeight;
    }
  }
  return;
}

Assistant:

void ImageResizeCanvas(Image *image, int newWidth, int newHeight, int offsetX, int offsetY, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else if ((newWidth != image->width) || (newHeight != image->height))
    {
        Rectangle srcRec = { 0, 0, (float)image->width, (float)image->height };
        Vector2 dstPos = { (float)offsetX, (float)offsetY };

        if (offsetX < 0)
        {
            srcRec.x = (float)-offsetX;
            srcRec.width += (float)offsetX;
            dstPos.x = 0;
        }
        else if ((offsetX + image->width) > newWidth) srcRec.width = (float)(newWidth - offsetX);

        if (offsetY < 0)
        {
            srcRec.y = (float)-offsetY;
            srcRec.height += (float)offsetY;
            dstPos.y = 0;
        }
        else if ((offsetY + image->height) > newHeight) srcRec.height = (float)(newHeight - offsetY);

        if (newWidth < srcRec.width) srcRec.width = (float)newWidth;
        if (newHeight < srcRec.height) srcRec.height = (float)newHeight;

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *resizedData = (unsigned char *)RL_CALLOC(newWidth*newHeight*bytesPerPixel, 1);

        // Fill resized canvas with fill color
        // Set first pixel with image->format
        SetPixelColor(resizedData, fill, image->format);

        // Fill remaining bytes of first row
        for (int x = 1; x < newWidth; x++)
        {
            memcpy(resizedData + x*bytesPerPixel, resizedData, bytesPerPixel);
        }
        // Copy the first row into the other rows
        for (int y = 1; y < newHeight; y++)
        {
            memcpy(resizedData + y*newWidth*bytesPerPixel, resizedData, newWidth*bytesPerPixel);
        }

        // Copy old image to resized canvas
        int dstOffsetSize = ((int)dstPos.y*newWidth + (int)dstPos.x)*bytesPerPixel;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            memcpy(resizedData + dstOffsetSize, ((unsigned char *)image->data) + ((y + (int)srcRec.y)*image->width + (int)srcRec.x)*bytesPerPixel, (int)srcRec.width*bytesPerPixel);
            dstOffsetSize += (newWidth*bytesPerPixel);
        }

        RL_FREE(image->data);
        image->data = resizedData;
        image->width = newWidth;
        image->height = newHeight;
    }
}